

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_byte_string<std::allocator<unsigned_char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
as_byte_string<std::allocator<unsigned_char>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  error_code ec_00;
  json_storage_kind jVar1;
  semantic_tag sVar2;
  bool bVar3;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
  *this_00;
  undefined8 uVar4;
  basic_byte_string<std::allocator<unsigned_char>_> *this_01;
  json_runtime_error<std::domain_error,_void> *this_02;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this_03;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RSI;
  basic_byte_string<std::allocator<unsigned_char>_> *in_RDI;
  string_view_type sVar5;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
  converter;
  error_code ec;
  byte_string_type *v;
  string *in_stack_ffffffffffffff08;
  error_code *in_stack_ffffffffffffff10;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff18;
  ser_error *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  error_code *in_stack_ffffffffffffffb0;
  semantic_tag in_stack_ffffffffffffffbf;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  error_category *in_stack_ffffffffffffffe8;
  
  std::error_code::error_code(in_stack_ffffffffffffff10);
  jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::storage_kind
                    (in_RSI);
  this_03 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
            (ulong)(byte)(jVar1 - short_str);
  switch(this_03) {
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x0:
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x8:
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
    ::value_converter((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
                       *)in_stack_ffffffffffffff30);
    sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_string_view(this_03);
    this_00 = (value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
               *)sVar5._M_len;
    sVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::tag
                      (in_stack_ffffffffffffff18);
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
    ::convert<char>(this_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,
                    in_stack_ffffffffffffffb0);
    bVar3 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
    if (bVar3) {
      uVar4 = __cxa_allocate_exception(0x58);
      ec_00._M_cat._0_7_ = in_stack_ffffffffffffff40;
      ec_00._0_8_ = uVar4;
      ec_00._M_cat._7_1_ = sVar2;
      ser_error::ser_error(in_stack_ffffffffffffff30,ec_00);
      __cxa_throw(uVar4,&ser_error::typeinfo,ser_error::~ser_error);
    }
    value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
    ::~value_converter((value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
                        *)0x342ad6);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x1:
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff10);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
    json_const_reference_storage::value((json_const_reference_storage *)0x342b9c);
    as_byte_string<std::allocator<unsigned_char>>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffffe8);
    break;
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x2:
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff10);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
    json_reference_storage::value((json_reference_storage *)0x342bc0);
    as_byte_string<std::allocator<unsigned_char>>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffffe8);
    break;
  default:
    this_02 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    json_runtime_error<std::domain_error,_void>::json_runtime_error
              (this_02,in_stack_ffffffffffffff08);
    __cxa_throw(this_02,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)0x5:
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff10);
    this_01 = (basic_byte_string<std::allocator<unsigned_char>_> *)
              basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
              byte_string_storage::data((byte_string_storage *)0x342b09);
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff10);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::byte_string_storage
    ::length((byte_string_storage *)0x342b20);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x342b37);
    basic_byte_string<std::allocator<unsigned_char>_>::basic_byte_string
              (this_01,(uint8_t *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
               (allocator<unsigned_char> *)in_stack_ffffffffffffff08);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x342b5f);
  }
  return in_RDI;
}

Assistant:

basic_byte_string<BAllocator> as_byte_string() const
        {
            using byte_string_type = basic_byte_string<BAllocator>;
            std::error_code ec;

            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    value_converter<jsoncons::string_view, byte_string_type> converter;
                    byte_string_type v = converter.convert(as_string_view(),tag(), ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        JSONCONS_THROW(ser_error(ec));
                    }
                    return v;
                }
                case json_storage_kind::byte_str:
                    return basic_byte_string<BAllocator>(cast<byte_string_storage>().data(),cast<byte_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_byte_string();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_byte_string();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a byte string"));
            }
        }